

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.cpp
# Opt level: O2

shared_ptr<Quad> __thiscall Quad::firstQuad(Quad *this)

{
  double *in_RSI;
  shared_ptr<Quad> sVar1;
  double local_18;
  double local_10;
  
  local_10 = *in_RSI + in_RSI[2] * 0.25;
  local_18 = in_RSI[2] * 0.25 + in_RSI[1];
  sVar1 = std::make_shared<Quad,double,double,double>(&this->xMid,&local_10,&local_18);
  sVar1.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Quad>)sVar1.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quad> Quad::firstQuad() {
    return std::make_shared<Quad>(this->xMid + this->length / 4.0, this->yMid + this->length / 4.0, this->length / 2.0);
}